

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

MetadataResult DumpTable(ShellState *state,char **azArg,idx_t nArg)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *__s1;
  idx_t iVar6;
  
  bVar1 = state->showHeader;
  uVar2 = state->shellFlgs;
  state->shellFlgs = uVar2 & 0xffffffa7;
  if (nArg < 2) {
    pcVar4 = (char *)0x0;
  }
  else {
    iVar6 = 1;
    pcVar4 = (char *)0x0;
    do {
      pcVar5 = azArg[iVar6];
      if (*pcVar5 == '-') {
        __s1 = pcVar5 + 1;
        if (pcVar5[1] == '-') {
          __s1 = pcVar5 + 2;
        }
        iVar3 = strcmp(__s1,"newlines");
        if (iVar3 != 0) {
          fprintf(_stderr,"Unknown option \"%s\" on \".dump\"\n",pcVar5);
          duckdb_shell_sqlite3_free(pcVar4);
          return FAIL;
        }
        *(byte *)&state->shellFlgs = (byte)state->shellFlgs | 0x10;
      }
      else if (pcVar4 == (char *)0x0) {
        pcVar4 = duckdb_shell_sqlite3_mprintf("name LIKE %Q ESCAPE \'\\\'");
      }
      else {
        pcVar4 = duckdb_shell_sqlite3_mprintf("%z OR name LIKE %Q ESCAPE \'\\\'",pcVar4,pcVar5);
      }
      iVar6 = iVar6 + 1;
    } while (nArg != iVar6);
  }
  duckdb_shell::ShellState::OpenDB(state,0);
  fwrite("BEGIN TRANSACTION;\n",0x13,1,(FILE *)state->out);
  state->showHeader = false;
  state->nErr = 0;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = duckdb_shell_sqlite3_mprintf("true");
  }
  pcVar5 = duckdb_shell_sqlite3_mprintf
                     ("SELECT name, type, sql FROM sqlite_schema WHERE (%s) AND type==\'table\'  AND sql NOT NULL ORDER BY tbl_name=\'sqlite_sequence\'"
                      ,pcVar4);
  duckdb_shell::ShellState::RunSchemaDumpQuery(state,pcVar5);
  duckdb_shell_sqlite3_free(pcVar5);
  pcVar5 = duckdb_shell_sqlite3_mprintf
                     ("SELECT sql FROM sqlite_schema WHERE (%s) AND sql NOT NULL  AND type IN (\'index\',\'trigger\',\'view\')"
                      ,pcVar4);
  duckdb_shell::ShellState::RunTableDumpQuery(state,pcVar5);
  duckdb_shell_sqlite3_free(pcVar5);
  duckdb_shell_sqlite3_free(pcVar4);
  pcVar4 = "ROLLBACK; -- due to errors\n";
  if (state->nErr == 0) {
    pcVar4 = "COMMIT;\n";
  }
  fprintf((FILE *)state->out,pcVar4);
  state->showHeader = bVar1;
  state->shellFlgs = uVar2;
  return SUCCESS;
}

Assistant:

MetadataResult DumpTable(ShellState &state, const char **azArg, idx_t nArg) {
	char *zLike = 0;
	char *zSql;
	bool savedShowHeader = state.showHeader;
	int savedShellFlags = state.shellFlgs;
	state.ShellClearFlag(SHFLG_PreserveRowid | SHFLG_Newlines | SHFLG_Echo);
	for (idx_t i = 1; i < nArg; i++) {
		if (azArg[i][0] == '-') {
			const char *z = azArg[i] + 1;
			if (z[0] == '-')
				z++;
			if (strcmp(z, "newlines") == 0) {
				state.ShellSetFlag(SHFLG_Newlines);
			} else {
				raw_printf(stderr, "Unknown option \"%s\" on \".dump\"\n", azArg[i]);
				sqlite3_free(zLike);
				return MetadataResult::FAIL;
			}
		} else if (zLike) {
			zLike = sqlite3_mprintf("%z OR name LIKE %Q ESCAPE '\\'", zLike, azArg[i]);
		} else {
			zLike = sqlite3_mprintf("name LIKE %Q ESCAPE '\\'", azArg[i]);
		}
	}

	state.OpenDB(0);

	/* When playing back a "dump", the content might appear in an order
	** which causes immediate foreign key constraints to be violated.
	** So disable foreign-key constraint enforcement to prevent problems. */
	raw_printf(state.out, "BEGIN TRANSACTION;\n");
	state.showHeader = 0;
	state.nErr = 0;
	if (zLike == 0)
		zLike = sqlite3_mprintf("true");
	zSql = sqlite3_mprintf("SELECT name, type, sql FROM sqlite_schema "
	                       "WHERE (%s) AND type=='table'"
	                       "  AND sql NOT NULL"
	                       " ORDER BY tbl_name='sqlite_sequence'",
	                       zLike);
	state.RunSchemaDumpQuery(zSql);
	sqlite3_free(zSql);
	zSql = sqlite3_mprintf("SELECT sql FROM sqlite_schema "
	                       "WHERE (%s) AND sql NOT NULL"
	                       "  AND type IN ('index','trigger','view')",
	                       zLike);
	state.RunTableDumpQuery(zSql);
	sqlite3_free(zSql);
	sqlite3_free(zLike);
	raw_printf(state.out, state.nErr ? "ROLLBACK; -- due to errors\n" : "COMMIT;\n");
	state.showHeader = savedShowHeader;
	state.shellFlgs = savedShellFlags;
	return MetadataResult::SUCCESS;
}